

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool bloaty::RollupOutput::IsSame(string *a,string *b)

{
  pointer pcVar1;
  size_type sVar2;
  __type _Var3;
  bool bVar4;
  bool bVar5;
  string_view text;
  string_view text_00;
  string_view suffix;
  string_view suffix_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  _Var3 = std::operator==(a,b);
  bVar5 = true;
  if (!_Var3) {
    pcVar1 = (b->_M_dataplus)._M_p;
    sVar2 = b->_M_string_length;
    std::operator+(&local_70,a,"]");
    text._M_str = pcVar1;
    text._M_len = sVar2;
    suffix._M_str = local_70._M_dataplus._M_p;
    suffix._M_len = local_70._M_string_length;
    bVar4 = absl::EndsWith(text,suffix);
    bVar5 = true;
    if (!bVar4) {
      pcVar1 = (a->_M_dataplus)._M_p;
      sVar2 = a->_M_string_length;
      std::operator+(&local_50,b,"]");
      text_00._M_str = pcVar1;
      text_00._M_len = sVar2;
      suffix_00._M_str = local_50._M_dataplus._M_p;
      suffix_00._M_len = local_50._M_string_length;
      bVar5 = absl::EndsWith(text_00,suffix_00);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return bVar5;
}

Assistant:

bool RollupOutput::IsSame(const std::string& a, const std::string& b) {
  if (a == b) {
    return true;
  }

  if (absl::EndsWith(b, a + "]") || absl::EndsWith(a, b + "]")) {
    return true;
  }

  return false;
}